

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_not_node.hpp
# Opt level: O1

void __thiscall
ranger::bhvr_tree::
decorator_not_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(decorator_not_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  handler_type *this_00;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *paVar1;
  bool local_61;
  function<void(bool,test_agent*)> local_60 [16];
  code *local_50;
  anon_class_40_2_74ab42ec local_40;
  
  paVar1 = (this->
           super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           ).m_first_child._M_t.
           super___uniq_ptr_impl<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>_>
           .
           super__Head_base<0UL,_ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*,_false>
           ._M_head_impl;
  if (paVar1 == (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 *)0x0) {
    local_40.ap = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                   *)ap->m_agent;
    local_61 = false;
    if ((hdl->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*hdl->_M_invoker)((_Any_data *)hdl,&local_61,(test_agent **)&local_40);
  }
  else {
    this_00 = &local_40.hdl;
    local_40.ap = ap;
    std::function<void_(bool,_test_agent_*)>::function(this_00,hdl);
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::decorator_not_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              (local_60,&local_40);
    (*paVar1->_vptr_abstract_node[2])(paVar1,ap,local_60);
    if (local_50 != (code *)0x0) {
      (*local_50)(local_60,local_60,3);
    }
    if (local_40.hdl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_40.hdl.super__Function_base._M_manager)
                ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
    }
  }
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    auto node = this->get_first_child();
    if (node) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        ap(hdl, !result);
      });
    } else {
      ap(hdl, false);
    }
  }